

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O0

bool double_conversion::DigitGen
               (DiyFp low,DiyFp w,DiyFp high,Vector<char> buffer,int *length,int *kappa)

{
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  uint32_t number;
  bool bVar1;
  char cVar2;
  int32_t iVar3;
  int32_t exponent;
  uint64_t uVar4;
  uint64_t uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  DiyFp DVar9;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int digit_1;
  uint64_t rest;
  int digit;
  int divisor_exponent_plus_one;
  uint32_t divisor;
  uint64_t fractionals;
  uint32_t integrals;
  DiyFp one;
  DiyFp unsafe_interval;
  DiyFp too_high;
  DiyFp too_low;
  uint64_t unit;
  DiyFp *in_stack_fffffffffffffdf8;
  uint64_t in_stack_fffffffffffffe10;
  uint64_t in_stack_fffffffffffffe18;
  uint64_t in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  int iVar10;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  undefined8 in_stack_fffffffffffffe38;
  uint64_t in_stack_fffffffffffffe50;
  uint64_t in_stack_fffffffffffffe58;
  DiyFp local_118 [2];
  undefined4 local_ec;
  uint64_t local_e8;
  int32_t local_e0;
  DiyFp local_d8 [2];
  ulong local_b8;
  uint local_ac;
  int local_a8;
  uint local_a4;
  ulong local_a0;
  uint32_t local_94;
  DiyFp local_90;
  uint64_t local_80;
  int32_t local_78;
  DiyFp local_70;
  DiyFp local_60;
  DiyFp local_50;
  long local_40;
  DiyFp local_38;
  DiyFp local_28;
  DiyFp local_18;
  
  local_40 = 1;
  uVar4 = DiyFp::f(&local_18);
  uVar4 = uVar4 - local_40;
  iVar3 = DiyFp::e(&local_18);
  DiyFp::DiyFp(&local_50,uVar4,iVar3);
  uVar4 = DiyFp::f(&local_38);
  uVar4 = uVar4 + local_40;
  iVar3 = DiyFp::e(&local_38);
  DiyFp::DiyFp(&local_60,uVar4,iVar3);
  DVar9 = DiyFp::Minus(in_stack_fffffffffffffdf8,(DiyFp *)0xa1c90e);
  local_80 = DVar9.f_;
  local_78 = DVar9.e_;
  local_70.f_ = local_80;
  local_70.e_ = local_78;
  iVar3 = DiyFp::e(&local_28);
  exponent = DiyFp::e(&local_28);
  DiyFp::DiyFp(&local_90,1L << (-(char)iVar3 & 0x3fU),exponent);
  uVar4 = DiyFp::f(&local_60);
  iVar3 = DiyFp::e(&local_90);
  local_94 = (uint32_t)(uVar4 >> (-(char)iVar3 & 0x3fU));
  uVar4 = DiyFp::f(&local_60);
  uVar5 = DiyFp::f(&local_90);
  number = local_94;
  local_a0 = uVar4 & uVar5 - 1;
  iVar3 = DiyFp::e(&local_90);
  BiggestPowerTen(number,iVar3 + 0x40,&local_a4,&local_a8);
  *in_stack_00000020 = local_a8;
  *in_stack_00000018 = 0;
  while( true ) {
    if (*in_stack_00000020 < 1) {
      do {
        local_a0 = local_a0 * 10;
        local_40 = local_40 * 10;
        uVar4 = DiyFp::f(&local_70);
        DiyFp::set_f(&local_70,uVar4 * 10);
        uVar7 = local_a0;
        iVar3 = DiyFp::e(&local_90);
        uVar8 = uVar7 >> (-(char)iVar3 & 0x3fU);
        local_ec = (undefined4)uVar8;
        cVar2 = (char)uVar8 + '0';
        pcVar6 = Vector<char>::operator[]((Vector<char> *)&stack0x00000008,*in_stack_00000018);
        iVar10 = (int)(uVar7 >> 0x20);
        *pcVar6 = cVar2;
        *in_stack_00000018 = *in_stack_00000018 + 1;
        uVar4 = DiyFp::f(&local_90);
        uVar7 = uVar4 - 1 & local_a0;
        *in_stack_00000020 = *in_stack_00000020 + -1;
        local_a0 = uVar7;
        uVar4 = DiyFp::f(&local_70);
      } while (uVar4 <= uVar7);
      DVar9 = DiyFp::Minus(in_stack_fffffffffffffdf8,(DiyFp *)0xa1cdb4);
      local_118[0].f_ = DVar9.f_;
      local_118[0].e_ = DVar9.e_;
      uVar4 = DiyFp::f(local_118);
      uVar4 = uVar4 * local_40;
      uVar5 = DiyFp::f(&local_70);
      uVar8 = local_a0;
      DiyFp::f(&local_90);
      buffer_01.start_._7_1_ = cVar2;
      buffer_01.start_._0_7_ = in_stack_fffffffffffffe30;
      buffer_01._8_8_ = uVar7;
      bVar1 = RoundWeed(buffer_01,iVar10,uVar8,uVar5,uVar4,in_stack_fffffffffffffe50,
                        in_stack_fffffffffffffe58);
      return bVar1;
    }
    local_ac = local_94 / local_a4;
    cVar2 = (char)local_ac;
    pcVar6 = Vector<char>::operator[]((Vector<char> *)&stack0x00000008,*in_stack_00000018);
    *pcVar6 = cVar2 + '0';
    *in_stack_00000018 = *in_stack_00000018 + 1;
    local_94 = local_94 % local_a4;
    *in_stack_00000020 = *in_stack_00000020 + -1;
    uVar7 = (ulong)local_94;
    iVar3 = DiyFp::e(&local_90);
    uVar7 = (uVar7 << (-(char)iVar3 & 0x3fU)) + local_a0;
    local_b8 = uVar7;
    uVar4 = DiyFp::f(&local_70);
    iVar10 = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
    if (uVar7 < uVar4) break;
    local_a4 = local_a4 / 10;
  }
  DVar9 = DiyFp::Minus(in_stack_fffffffffffffdf8,(DiyFp *)0xa1cb8b);
  local_e8 = DVar9.f_;
  local_e0 = DVar9.e_;
  local_d8[0].f_ = local_e8;
  local_d8[0].e_ = local_e0;
  DiyFp::f(local_d8);
  uVar4 = DiyFp::f(&local_70);
  uVar7 = local_b8;
  DiyFp::e(&local_90);
  buffer_00.start_._7_1_ = in_stack_fffffffffffffe37;
  buffer_00.start_._0_7_ = in_stack_fffffffffffffe30;
  buffer_00._8_8_ = in_stack_fffffffffffffe38;
  bVar1 = RoundWeed(buffer_00,iVar10,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                    in_stack_fffffffffffffe10,uVar4,uVar7);
  return bVar1;
}

Assistant:

static bool DigitGen(DiyFp low,
                     DiyFp w,
                     DiyFp high,
                     Vector<char> buffer,
                     int* length,
                     int* kappa) {
  DOUBLE_CONVERSION_ASSERT(low.e() == w.e() && w.e() == high.e());
  DOUBLE_CONVERSION_ASSERT(low.f() + 1 <= high.f() - 1);
  DOUBLE_CONVERSION_ASSERT(kMinimalTargetExponent <= w.e() && w.e() <= kMaximalTargetExponent);
  // low, w and high are imprecise, but by less than one ulp (unit in the last
  // place).
  // If we remove (resp. add) 1 ulp from low (resp. high) we are certain that
  // the new numbers are outside of the interval we want the final
  // representation to lie in.
  // Inversely adding (resp. removing) 1 ulp from low (resp. high) would yield
  // numbers that are certain to lie in the interval. We will use this fact
  // later on.
  // We will now start by generating the digits within the uncertain
  // interval. Later we will weed out representations that lie outside the safe
  // interval and thus _might_ lie outside the correct interval.
  uint64_t unit = 1;
  DiyFp too_low = DiyFp(low.f() - unit, low.e());
  DiyFp too_high = DiyFp(high.f() + unit, high.e());
  // too_low and too_high are guaranteed to lie outside the interval we want the
  // generated number in.
  DiyFp unsafe_interval = DiyFp::Minus(too_high, too_low);
  // We now cut the input number into two parts: the integral digits and the
  // fractionals. We will not write any decimal separator though, but adapt
  // kappa instead.
  // Reminder: we are currently computing the digits (stored inside the buffer)
  // such that:   too_low < buffer * 10^kappa < too_high
  // We use too_high for the digit_generation and stop as soon as possible.
  // If we stop early we effectively round down.
  DiyFp one = DiyFp(static_cast<uint64_t>(1) << -w.e(), w.e());
  // Division by one is a shift.
  uint32_t integrals = static_cast<uint32_t>(too_high.f() >> -one.e());
  // Modulo by one is an and.
  uint64_t fractionals = too_high.f() & (one.f() - 1);
  uint32_t divisor;
  int divisor_exponent_plus_one;
  BiggestPowerTen(integrals, DiyFp::kSignificandSize - (-one.e()),
                  &divisor, &divisor_exponent_plus_one);
  *kappa = divisor_exponent_plus_one;
  *length = 0;
  // Loop invariant: buffer = too_high / 10^kappa  (integer division)
  // The invariant holds for the first iteration: kappa has been initialized
  // with the divisor exponent + 1. And the divisor is the biggest power of ten
  // that is smaller than integrals.
  while (*kappa > 0) {
    int digit = integrals / divisor;
    DOUBLE_CONVERSION_ASSERT(digit <= 9);
    buffer[*length] = static_cast<char>('0' + digit);
    (*length)++;
    integrals %= divisor;
    (*kappa)--;
    // Note that kappa now equals the exponent of the divisor and that the
    // invariant thus holds again.
    uint64_t rest =
        (static_cast<uint64_t>(integrals) << -one.e()) + fractionals;
    // Invariant: too_high = buffer * 10^kappa + DiyFp(rest, one.e())
    // Reminder: unsafe_interval.e() == one.e()
    if (rest < unsafe_interval.f()) {
      // Rounding down (by not emitting the remaining digits) yields a number
      // that lies within the unsafe interval.
      return RoundWeed(buffer, *length, DiyFp::Minus(too_high, w).f(),
                       unsafe_interval.f(), rest,
                       static_cast<uint64_t>(divisor) << -one.e(), unit);
    }
    divisor /= 10;
  }

  // The integrals have been generated. We are at the point of the decimal
  // separator. In the following loop we simply multiply the remaining digits by
  // 10 and divide by one. We just need to pay attention to multiply associated
  // data (like the interval or 'unit'), too.
  // Note that the multiplication by 10 does not overflow, because w.e >= -60
  // and thus one.e >= -60.
  DOUBLE_CONVERSION_ASSERT(one.e() >= -60);
  DOUBLE_CONVERSION_ASSERT(fractionals < one.f());
  DOUBLE_CONVERSION_ASSERT(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFFFFFF, FFFFFFFF) / 10 >= one.f());
  for (;;) {
    fractionals *= 10;
    unit *= 10;
    unsafe_interval.set_f(unsafe_interval.f() * 10);
    // Integer division by one.
    int digit = static_cast<int>(fractionals >> -one.e());
    DOUBLE_CONVERSION_ASSERT(digit <= 9);
    buffer[*length] = static_cast<char>('0' + digit);
    (*length)++;
    fractionals &= one.f() - 1;  // Modulo by one.
    (*kappa)--;
    if (fractionals < unsafe_interval.f()) {
      return RoundWeed(buffer, *length, DiyFp::Minus(too_high, w).f() * unit,
                       unsafe_interval.f(), fractionals, one.f(), unit);
    }
  }
}